

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::~Regexp(Regexp *this)

{
  char cVar1;
  string *this_00;
  void *pvVar2;
  ostream *poVar3;
  char *in_RDI;
  CharClass *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  
  if (*(short *)(in_RDI + 6) != 0) {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    poVar3 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe78);
    std::operator<<(poVar3,"Regexp not destroyed.");
    LogMessage::~LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  }
  cVar1 = *in_RDI;
  if (cVar1 == '\x04') {
    if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x20));
    }
  }
  else if (cVar1 == '\v') {
    this_00 = *(string **)(in_RDI + 0x20);
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
  }
  else if (cVar1 == '\x14') {
    if (*(long *)(in_RDI + 0x18) != 0) {
      CharClass::Delete(in_stack_fffffffffffffe50);
    }
    pvVar2 = *(void **)(in_RDI + 0x20);
    if (pvVar2 != (void *)0x0) {
      CharClassBuilder::~CharClassBuilder((CharClassBuilder *)0x2092bd);
      operator_delete(pvVar2);
    }
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete name_;
      break;
    case kRegexpLiteralString:
      delete[] runes_;
      break;
    case kRegexpCharClass:
      if (cc_)
        cc_->Delete();
      delete ccb_;
      break;
  }
}